

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_utility.cpp
# Opt level: O0

HexDataStruct *
cfd::js::api::UtilStructApi::DecodeBase64
          (HexDataStruct *__return_storage_ptr__,Base64DataStruct *request)

{
  Base64DataStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&)> local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  Base64DataStruct *pBStack_18;
  anon_class_1_0_00000001 call_func;
  Base64DataStruct *request_local;
  HexDataStruct *result;
  
  local_1a = 0;
  pBStack_18 = request;
  HexDataStruct::HexDataStruct(__return_storage_ptr__);
  this = pBStack_18;
  std::function<cfd::js::api::HexDataStruct(cfd::js::api::Base64DataStruct_const&)>::
  function<cfd::js::api::UtilStructApi::DecodeBase64(cfd::js::api::Base64DataStruct_const&)::__0&,void>
            ((function<cfd::js::api::HexDataStruct(cfd::js::api::Base64DataStruct_const&)> *)
             local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"DecodeBase64",&local_129);
  ExecuteStructApi<cfd::js::api::Base64DataStruct,cfd::js::api::HexDataStruct>
            ((HexDataStruct *)(local_108 + 0x20),(api *)this,(Base64DataStruct *)local_108,
             &local_128,in_R8);
  HexDataStruct::operator=(__return_storage_ptr__,(HexDataStruct *)(local_108 + 0x20));
  HexDataStruct::~HexDataStruct((HexDataStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::function<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&)>::~function
            ((function<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&)> *)
             local_108);
  return __return_storage_ptr__;
}

Assistant:

HexDataStruct UtilStructApi::DecodeBase64(const Base64DataStruct& request) {
  auto call_func = [](const Base64DataStruct& request) -> HexDataStruct {
    HexDataStruct result;
    ByteData data = CryptoUtil::DecodeBase64(request.base64);
    if ((!request.base64.empty()) && data.IsEmpty()) {
      warn(CFD_LOG_SOURCE, "Failed to parameter. Decode base64 error.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Decode base64 error.");
    }
    result.hex = data.GetHex();
    return result;
  };

  HexDataStruct result;
  result = ExecuteStructApi<Base64DataStruct, HexDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}